

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O3

int unres_data_add(unres_data *unres,lyd_node *node,UNRES_ITEM type)

{
  lyd_node **pplVar1;
  UNRES_ITEM *pUVar2;
  uint uVar3;
  
  if ((unres == (unres_data *)0x0) || (node == (lyd_node *)0x0)) {
    __assert_fail("unres && node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x205a,
                  "int unres_data_add(struct unres_data *, struct lyd_node *, enum UNRES_ITEM)");
  }
  if ((int)type < 0x400000) {
    if (((type != UNRES_LEAFREF) && (type != UNRES_INSTID)) && (type != UNRES_WHEN))
    goto LAB_0011c732;
  }
  else if ((int)type < 0x1000000) {
    if ((type != UNRES_MUST) && (type != UNRES_MUST_INOUT)) {
LAB_0011c732:
      __assert_fail("(type == UNRES_LEAFREF) || (type == UNRES_INSTID) || (type == UNRES_WHEN) || (type == UNRES_MUST) || (type == UNRES_MUST_INOUT) || (type == UNRES_UNION) || (type == UNRES_UNIQ_LEAVES)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                    ,0x205c,
                    "int unres_data_add(struct unres_data *, struct lyd_node *, enum UNRES_ITEM)");
    }
  }
  else if ((type != UNRES_UNION) && (type != UNRES_UNIQ_LEAVES)) goto LAB_0011c732;
  uVar3 = unres->count + 1;
  unres->count = uVar3;
  pplVar1 = (lyd_node **)ly_realloc(unres->node,(ulong)uVar3 << 3);
  unres->node = pplVar1;
  if (pplVar1 != (lyd_node **)0x0) {
    uVar3 = unres->count;
    pplVar1[uVar3 - 1] = node;
    pUVar2 = (UNRES_ITEM *)ly_realloc(unres->type,(ulong)uVar3 << 2);
    unres->type = pUVar2;
    if (pUVar2 != (UNRES_ITEM *)0x0) {
      pUVar2[unres->count - 1] = type;
      return 0;
    }
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","unres_data_add");
  return -1;
}

Assistant:

int
unres_data_add(struct unres_data *unres, struct lyd_node *node, enum UNRES_ITEM type)
{
    assert(unres && node);
    assert((type == UNRES_LEAFREF) || (type == UNRES_INSTID) || (type == UNRES_WHEN) || (type == UNRES_MUST)
           || (type == UNRES_MUST_INOUT) || (type == UNRES_UNION) || (type == UNRES_UNIQ_LEAVES));

    unres->count++;
    unres->node = ly_realloc(unres->node, unres->count * sizeof *unres->node);
    LY_CHECK_ERR_RETURN(!unres->node, LOGMEM(NULL), -1);
    unres->node[unres->count - 1] = node;
    unres->type = ly_realloc(unres->type, unres->count * sizeof *unres->type);
    LY_CHECK_ERR_RETURN(!unres->type, LOGMEM(NULL), -1);
    unres->type[unres->count - 1] = type;

    return 0;
}